

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_func_jit(jit_State *J,TraceNo lnk)

{
  uint64_t uVar1;
  BCIns *pBVar2;
  TraceLink linktype;
  
  rec_func_setup(J);
  uVar1 = J->trace[lnk].gcptr64;
  if (*(char *)(uVar1 + 0x74) == '\a') {
    check_call_unroll(J,lnk);
    pBVar2 = J->pc;
    J->patchins = *pBVar2;
    J->patchpc = pBVar2;
    *pBVar2 = *(BCIns *)(uVar1 + 0x50);
    return;
  }
  J->instunroll = 0;
  if ((J->pc == J->startpc) && (J->framedepth + J->retdepth == 0)) {
    lnk = (TraceNo)(J->cur).traceno;
    linktype = LJ_TRLINK_TAILREC;
  }
  else {
    linktype = LJ_TRLINK_ROOT;
  }
  lj_record_stop(J,linktype,lnk);
  return;
}

Assistant:

static void rec_func_jit(jit_State *J, TraceNo lnk)
{
  GCtrace *T;
  rec_func_setup(J);
  T = traceref(J, lnk);
  if (T->linktype == LJ_TRLINK_RETURN) {  /* Trace returns to interpreter? */
    check_call_unroll(J, lnk);
    /* Temporarily unpatch JFUNC* to continue recording across function. */
    J->patchins = *J->pc;
    J->patchpc = (BCIns *)J->pc;
    *J->patchpc = T->startins;
    return;
  }
  J->instunroll = 0;  /* Cannot continue across a compiled function. */
  if (J->pc == J->startpc && J->framedepth + J->retdepth == 0)
    lj_record_stop(J, LJ_TRLINK_TAILREC, J->cur.traceno);  /* Extra tail-rec. */
  else
    lj_record_stop(J, LJ_TRLINK_ROOT, lnk);  /* Link to the function. */
}